

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O3

void __thiscall
Descriptor_Parse_Taproot_tapleaf_pubkey_Test::~Descriptor_Parse_Taproot_tapleaf_pubkey_Test
          (Descriptor_Parse_Taproot_tapleaf_pubkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_tapleaf_pubkey) {
  //   pubkey: '04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77',
  //   privkey: '5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC'
  std::string internal_pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string descriptor1 = "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,pk(8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816))";
  std::string descriptor2 = "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a, {})";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  TaprootScriptTree tree;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kRegtest;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_TRUE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(tree = script_ref.GetScriptTree());
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bcrt1p2druqmxfa49j9ph0ea8d9y4gzrhy2x7u2zj0p2622d9r7k28v02s6x9jx3");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 5347c06cc9ed4b2286efcf4ed292a810ee451bdc50a4f0ab4a534a3f594763d5");
  EXPECT_STREQ(pubkey.GetHex().c_str(), pubkey_hex.c_str());
  EXPECT_STREQ(tree.ToString().c_str(),
      "tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac)");
  EXPECT_STREQ(tree.GetScript().GetHex().c_str(),
      "208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac");

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Failed to taproot. empty script.", except.what());
  }
}